

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  u16 *puVar1;
  char cVar2;
  PCache *pPVar3;
  sqlite3_file *psVar4;
  sqlite3_io_methods *psVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Btree *p;
  Pager *__s;
  Btree *pBVar13;
  char *pcVar14;
  Pager *__dest;
  long lVar15;
  Btree *pBVar16;
  void *pvVar17;
  long lVar18;
  Pager *pPVar19;
  sqlite3_mutex *psVar20;
  sqlite3_mutex *psVar21;
  Btree **ppBVar22;
  code *pcVar23;
  long lVar24;
  Btree *pBVar25;
  u8 uVar26;
  int iVar27;
  char *pcVar28;
  char *pcVar29;
  size_t __n;
  byte bVar30;
  uint uVar31;
  u8 uVar32;
  uint uVar33;
  u64 uVar34;
  bool bVar35;
  uchar zDbHeader [100];
  sqlite3_mutex *local_118;
  uint local_9c;
  uint local_98 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if (zFilename == (char *)0x0) {
    bVar35 = true;
LAB_0011e788:
    if ((!bVar35) || (bVar7 = 1, db->temp_store != '\x02')) {
      bVar7 = (byte)vfsFlags >> 7;
    }
  }
  else {
    bVar35 = *zFilename == '\0';
    iVar8 = strcmp(zFilename,":memory:");
    if (iVar8 != 0) goto LAB_0011e788;
    bVar7 = 1;
  }
  uVar12 = flags | 2;
  if (bVar7 == 0) {
    uVar12 = flags;
  }
  uVar31 = vfsFlags & 0xfffffcffU | 0x200;
  if (bVar7 == 0 && !bVar35) {
    uVar31 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar31 = vfsFlags;
  }
  p = (Btree *)sqlite3Malloc(0x48);
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->db = (sqlite3 *)0x0;
  p->pBt = (BtShared *)0x0;
  (p->lock).pBtree = (Btree *)0x0;
  (p->lock).iTable = 0;
  (p->lock).eLock = '\0';
  *(undefined3 *)&(p->lock).field_0xd = 0;
  p->pNext = (Btree *)0x0;
  p->pPrev = (Btree *)0x0;
  p->inTrans = '\0';
  p->sharable = '\0';
  p->locked = '\0';
  p->field_0x13 = 0;
  p->wantToLock = 0;
  p->nBackup = 0;
  p->iDataVersion = 0;
  (p->lock).pNext = (BtLock *)0x0;
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  if ((!bVar35) && ((uVar31 >> 0x11 & 1) != 0 && ((uVar31 & 0x40) == 0 & bVar7) == 0)) {
    if (zFilename == (char *)0x0) {
      uVar33 = 1;
    }
    else {
      uVar33 = 0xffffffff;
      pcVar14 = zFilename;
      do {
        uVar33 = uVar33 + 1;
        cVar2 = *pcVar14;
        pcVar14 = pcVar14 + 1;
      } while (cVar2 != '\0');
      uVar33 = (uVar33 & 0x3fffffff) + 1;
    }
    uVar9 = pVfs->mxPathname + 1;
    uVar11 = uVar33;
    if ((int)uVar33 < (int)uVar9) {
      uVar11 = uVar9;
    }
    pBVar13 = (Btree *)sqlite3Malloc((ulong)uVar11);
    p->sharable = '\x01';
    if (pBVar13 != (Btree *)0x0) {
      if (bVar7 == 0) {
        *(undefined1 *)&pBVar13->db = 0;
        iVar8 = (*pVfs->xFullPathname)(pVfs,zFilename,uVar9,(char *)pBVar13);
        if (iVar8 != 0) {
          sqlite3_free(pBVar13);
          bVar35 = false;
          local_118 = (sqlite3_mutex *)0x0;
          __s = (Pager *)0x0;
          pBVar13 = p;
          iVar10 = iVar8;
          goto LAB_0011f0e1;
        }
      }
      else {
        memcpy(pBVar13,zFilename,(ulong)uVar33);
      }
      if (sqlite3Config.bCoreMutex == 0) {
        local_118 = (sqlite3_mutex *)0x0;
      }
      else {
        local_118 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      }
      if (local_118 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(local_118);
      }
      if (sqlite3Config.bCoreMutex == 0) {
        psVar20 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar20 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      }
      __s = (Pager *)sqlite3SharedCacheList;
      if (psVar20 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar20);
        __s = (Pager *)sqlite3SharedCacheList;
      }
      for (; __s != (Pager *)0x0; __s = (Pager *)__s->journalHdr) {
        pPVar19 = (Pager *)__s->pVfs;
        iVar8 = strcmp((char *)pBVar13,pPVar19->zFilename);
        if ((iVar8 == 0) && (pPVar19->pVfs == pVfs)) {
          lVar24 = (long)db->nDb;
          bVar35 = lVar24 < 1;
          if (lVar24 < 1) goto LAB_0011ee09;
          ppBVar22 = &db->aDb[lVar24 + -1].pBt;
          lVar24 = lVar24 + 1;
          goto LAB_0011ede6;
        }
      }
      goto LAB_0011f0c1;
    }
    iVar10 = 7;
    bVar35 = false;
    iVar8 = 0;
    local_118 = (sqlite3_mutex *)0x0;
    __s = (Pager *)0x0;
    pBVar13 = p;
    goto LAB_0011f0e1;
  }
  iVar8 = 0;
  local_118 = (sqlite3_mutex *)0x0;
  __s = (Pager *)0x0;
  goto LAB_0011e84a;
LAB_0011e8a0:
  do {
    pBVar16 = pBVar13;
    pBVar13 = pBVar16->pPrev;
  } while (pBVar16->pPrev != (Btree *)0x0);
  if (p->pBt < pBVar16->pBt) {
    p->pNext = pBVar16;
    ppBVar22 = &pBVar16->pPrev;
    p->pPrev = (Btree *)0x0;
  }
  else {
    do {
      pBVar13 = pBVar16;
      pBVar16 = pBVar13->pNext;
      if (pBVar16 == (Btree *)0x0) {
        p->pNext = (Btree *)0x0;
        pBVar16 = p;
        pBVar25 = pBVar13;
        goto LAB_0011ed28;
      }
    } while (pBVar16->pBt < p->pBt);
    p->pNext = pBVar16;
    p->pPrev = pBVar13;
    pBVar25 = p;
    if (pBVar16 != (Btree *)0x0) {
LAB_0011ed28:
      pBVar16->pPrev = pBVar25;
    }
    ppBVar22 = &pBVar13->pNext;
  }
  *ppBVar22 = p;
  goto LAB_0011ed33;
  while( true ) {
    lVar18 = lVar24 + -1;
    ppBVar22 = ppBVar22 + -4;
    lVar15 = lVar24 + -3;
    bVar35 = lVar18 < 2;
    lVar24 = lVar18;
    if (SBORROW8(lVar18,2) != lVar15 < 0) break;
LAB_0011ede6:
    if ((*ppBVar22 != (Btree *)0x0) && ((Pager *)(*ppBVar22)->pBt == __s)) {
      if (psVar20 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar20);
      }
      if (local_118 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(local_118);
      }
      sqlite3_free(pBVar13);
      sqlite3_free(p);
      goto LAB_0011f0bb;
    }
  }
LAB_0011ee09:
  p->pBt = (BtShared *)__s;
  *(int *)&__s->journalOff = (int)__s->journalOff + 1;
LAB_0011f0bb:
  if (bVar35) {
LAB_0011f0c1:
    iVar8 = 0;
    bVar35 = true;
    iVar10 = 0x13;
    if (psVar20 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar20);
    }
LAB_0011f0e1:
    sqlite3_free(pBVar13);
  }
  else {
    iVar10 = 0x13;
    bVar35 = false;
    iVar8 = 0;
  }
  if (!bVar35) {
    return iVar10;
  }
LAB_0011e84a:
  if (__s == (Pager *)0x0) {
    __s = (Pager *)sqlite3Malloc(0x88);
    uVar33 = 0;
    if (__s == (Pager *)0x0) {
      iVar8 = 7;
      __s = (Pager *)0x0;
      goto LAB_0011ed37;
    }
    memset(__s,0,0x88);
    local_98[0] = 0x400;
    uVar11 = 0x30;
    if (0x30 < pVfs->szOsFile) {
      uVar11 = pVfs->szOsFile + 7U & 0xfffffff8;
    }
    __s->pVfs = (sqlite3_vfs *)0x0;
    uVar9 = uVar12 & 2;
    pcVar14 = zFilename;
    pPVar19 = __s;
    if (uVar9 == 0) {
      uVar26 = '\0';
      __dest = (Pager *)0x0;
LAB_0011eb9a:
      iVar8 = (int)pPVar19;
      if ((pcVar14 == (char *)0x0) || (*pcVar14 == '\0')) {
        iVar10 = 0;
        pcVar29 = (char *)0x0;
        iVar27 = 0;
      }
      else {
        uVar33 = pVfs->mxPathname + 1;
        __dest = (Pager *)sqlite3Malloc((long)pVfs->mxPathname * 2 + 2);
        if (__dest == (Pager *)0x0) {
          iVar8 = 7;
          iVar10 = 0;
          pcVar29 = (char *)0x0;
          iVar27 = 0;
          bVar35 = false;
        }
        else {
          *(undefined1 *)&__dest->pVfs = 0;
          iVar10 = (*pVfs->xFullPathname)(pVfs,pcVar14,uVar33,(char *)__dest);
          lVar24 = 0;
          do {
            pcVar29 = (char *)((long)&__dest->pVfs + lVar24);
            lVar24 = lVar24 + 1;
          } while (*pcVar29 != '\0');
          lVar15 = -1;
          do {
            lVar18 = lVar15 + 1;
            lVar15 = lVar15 + 1;
          } while (pcVar14[lVar18] != '\0');
          pcVar29 = pcVar14 + (ulong)((uint)lVar15 & 0x3fffffff) + 1;
          cVar2 = *pcVar29;
          pcVar28 = pcVar29;
          while (cVar2 != '\0') {
            lVar15 = -1;
            do {
              lVar18 = lVar15 + 1;
              lVar15 = lVar15 + 1;
            } while (pcVar28[lVar18] != '\0');
            uVar33 = (uint)lVar15 & 0x3fffffff;
            lVar15 = -1;
            do {
              lVar18 = lVar15 + (ulong)uVar33 + 2;
              lVar15 = lVar15 + 1;
            } while (pcVar28[lVar18] != '\0');
            pcVar28 = pcVar28 + (ulong)((uint)lVar15 & 0x3fffffff) + (ulong)uVar33 + 2;
            cVar2 = *pcVar28;
          }
          uVar33 = (int)lVar24 - 1U & 0x3fffffff;
          if ((iVar10 == 0) && (iVar10 = 0, pVfs->mxPathname < (int)(uVar33 + 8))) {
            sqlite3_log(0xe,"cannot open file at line %d of [%.10s]",0xb45b);
            iVar10 = 0xe;
          }
          iVar27 = ((int)pcVar28 - (int)pcVar29) + 1;
          if (iVar10 == 0) {
            bVar35 = true;
            iVar10 = 0;
          }
          else {
            sqlite3_free(__dest);
            bVar35 = false;
            iVar8 = iVar10;
          }
        }
        if (!bVar35) goto LAB_0011f2eb;
      }
      __n = (size_t)(int)uVar33;
      uVar34 = ((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) +
               (long)(int)(uVar11 * 2) + (long)iVar27 + __n * 3 + 0x189;
      pPVar19 = (Pager *)sqlite3Malloc(uVar34);
      if (pPVar19 == (Pager *)0x0) {
        iVar8 = 7;
        iVar10 = 7;
        if (__dest == (Pager *)0x0) goto LAB_0011f2eb;
      }
      else {
        memset(pPVar19,0,uVar34);
        pPVar19->pPCache = (PCache *)(pPVar19 + 1);
        pPVar19->fd = (sqlite3_file *)&pPVar19[1].jfd;
        pcVar28 = pPVar19[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x38);
        pPVar19->sjfd = (sqlite3_file *)pcVar28;
        pPVar19->jfd = (sqlite3_file *)(pcVar28 + (int)uVar11);
        pcVar28 = pcVar28 + (int)uVar11 + (int)uVar11;
        pPVar19->zFilename = pcVar28;
        if (__dest != (Pager *)0x0) {
          pPVar19->zJournal = pcVar28 + (int)(iVar27 + uVar33 + 1);
          memcpy(pcVar28,__dest,__n);
          if (iVar27 != 0) {
            memcpy(pPVar19->zFilename + (int)(uVar33 + 1),pcVar29,(long)iVar27);
          }
          memcpy(pPVar19->zJournal,__dest,__n);
          builtin_strncpy(pPVar19->zJournal + __n,"-journal",9);
          (pPVar19->zJournal + __n + 8)[1] = '\0';
          pPVar19->zWal = pPVar19->zJournal + __n + 9;
          memcpy(pPVar19->zJournal + __n + 9,__dest,__n);
          builtin_strncpy(pPVar19->zWal + __n,"-wal",5);
          sqlite3_free(__dest);
        }
        pPVar19->pVfs = pVfs;
        pPVar19->vfsFlags = uVar31;
        if ((pcVar14 == (char *)0x0) || (*pcVar14 == '\0')) {
LAB_0011f166:
          pPVar19->eState = '\x01';
          pPVar19->eLock = '\x04';
          pPVar19->noLock = '\x01';
          bVar30 = (byte)uVar31 & 1;
          uVar32 = '\x01';
          bVar35 = false;
        }
        else {
          local_9c = 0;
          iVar10 = (*pVfs->xOpen)(pVfs,pPVar19->zFilename,pPVar19->fd,uVar31 & 0x87f7f,
                                  (int *)&local_9c);
          uVar33 = local_9c & 1;
          bVar30 = (byte)uVar33;
          bVar35 = true;
          if (iVar10 == 0) {
            uVar11 = (*pPVar19->fd->pMethods->xDeviceCharacteristics)(pPVar19->fd);
            if (uVar33 == 0) {
              setSectorSize(pPVar19);
              uVar33 = pPVar19->sectorSize;
              if (local_98[0] < uVar33) {
                if (uVar33 < 0x2001) {
                  local_98[0] = uVar33;
                }
                else {
                  local_98[0] = 0x2000;
                }
              }
            }
            iVar8 = sqlite3_uri_boolean(pcVar14,"nolock",0);
            pPVar19->noLock = (u8)iVar8;
            if ((uVar11 >> 0xd & 1) == 0) {
              iVar8 = sqlite3_uri_boolean(pcVar14,"immutable",0);
              bVar6 = true;
              if (iVar8 == 0) goto LAB_0011f15d;
            }
            uVar31 = 1;
            bVar6 = false;
          }
          else {
            bVar6 = true;
          }
LAB_0011f15d:
          if (!bVar6) goto LAB_0011f166;
          uVar32 = '\0';
        }
        if (iVar10 == 0) {
          iVar10 = sqlite3PagerSetPagesize(pPVar19,local_98,-1);
        }
        if (iVar10 == 0) {
          pcVar23 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          if (uVar9 == 0) {
            pcVar23 = pagerStress;
          }
          pPVar3 = pPVar19->pPCache;
          pPVar3->szPage = 0;
          pPVar3->szExtra = 0;
          pPVar3->bPurgeable = '\0';
          pPVar3->eCreate = '\0';
          *(undefined6 *)&pPVar3->field_0x2a = 0;
          pPVar3->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          pPVar3->pStress = (void *)0x0;
          pPVar3->pSynced = (PgHdr *)0x0;
          pPVar3->nRef = 0;
          pPVar3->szCache = 0;
          pPVar3->pCache = (sqlite3_pcache *)0x0;
          pPVar3->pPage1 = (PgHdr *)0x0;
          pPVar3->pDirty = (PgHdr *)0x0;
          pPVar3->pDirtyTail = (PgHdr *)0x0;
          pPVar3->szPage = 1;
          pPVar3->szExtra = 0x78;
          pPVar3->bPurgeable = (byte)(uVar9 >> 1) ^ 1;
          pPVar3->eCreate = '\x02';
          pPVar3->xStress = pcVar23;
          pPVar3->pStress = pPVar19;
          pPVar3->szCache = 100;
          iVar10 = sqlite3PcacheSetPageSize(pPVar3,local_98[0]);
        }
        if (iVar10 == 0) {
          pPVar19->useJournal = (byte)(uVar12 & 1) ^ 1;
          pPVar19->mxPgno = 0x3fffffff;
          pPVar19->tempFile = uVar32;
          pPVar19->exclusiveMode = uVar32;
          pPVar19->changeCountDone = uVar32;
          pPVar19->memDb = uVar26;
          pPVar19->readOnly = bVar30;
          pPVar19->noSync = uVar32;
          if (bVar35) {
            pPVar19->fullSync = '\x01';
            pPVar19->ckptSyncFlags = '\x02';
            pPVar19->walSyncFlags = '\"';
            pPVar19->syncFlags = '\x02';
          }
          pPVar19->nExtra = 0x78;
          pPVar19->journalSizeLimit = -1;
          setSectorSize(pPVar19);
          if ((uVar12 & 3) != 0) {
            pPVar19->journalMode = ((uVar12 & 1) == 0) * '\x02' + '\x02';
          }
          pPVar19->xReiniter = pageReinit;
          __s->pVfs = (sqlite3_vfs *)pPVar19;
          iVar8 = 0;
          goto LAB_0011f2eb;
        }
        psVar4 = pPVar19->fd;
        if (psVar4->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar4->pMethods->xClose)(psVar4);
          psVar4->pMethods = (sqlite3_io_methods *)0x0;
        }
        pcache1Free(pPVar19->pTmpSpace);
        __dest = pPVar19;
      }
      iVar8 = iVar10;
      sqlite3_free(__dest);
    }
    else {
      uVar26 = '\x01';
      if (zFilename == (char *)0x0) {
        __dest = (Pager *)0x0;
        uVar33 = 0;
        pcVar14 = (char *)0x0;
        goto LAB_0011eb9a;
      }
      if (*zFilename == '\0') {
        __dest = (Pager *)0x0;
        uVar33 = 0;
        goto LAB_0011eb9a;
      }
      lVar24 = -1;
      do {
        lVar15 = lVar24 + 1;
        lVar24 = lVar24 + 1;
      } while (zFilename[lVar15] != '\0');
      uVar34 = (ulong)((uint)lVar24 & 0x3fffffff) + 1;
      __dest = (Pager *)sqlite3Malloc(uVar34);
      if (__dest != (Pager *)0x0) {
        memcpy(__dest,zFilename,uVar34);
        lVar24 = 0;
        do {
          pcVar14 = (char *)((long)&__dest->pVfs + lVar24);
          lVar24 = lVar24 + 1;
        } while (*pcVar14 != '\0');
        uVar33 = (int)lVar24 - 1U & 0x3fffffff;
        pcVar14 = (char *)0x0;
        pPVar19 = __dest;
        goto LAB_0011eb9a;
      }
      iVar8 = 7;
    }
LAB_0011f2eb:
    if (iVar8 == 0) {
      pPVar19 = (Pager *)__s->pVfs;
      pPVar19->szMmap = db->szMmap;
      pagerFixMaplimit(pPVar19);
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98[0] = 0;
      local_98[1] = 0;
      local_98[2] = 0;
      local_98[3] = 0;
      local_38 = 0;
      psVar4 = ((Pager *)__s->pVfs)->fd;
      psVar5 = psVar4->pMethods;
      if (psVar5 == (sqlite3_io_methods *)0x0) {
        iVar8 = 0;
      }
      else {
        iVar8 = (*psVar5->xRead)(psVar4,local_98,100,0);
        if (iVar8 == 0x20a) {
          iVar8 = 0;
        }
      }
    }
    if (iVar8 != 0) goto LAB_0011ed37;
    *(u8 *)&__s->dbOrigSize = (u8)uVar12;
    *(sqlite3 **)&__s->exclusiveMode = db;
    pPVar19 = (Pager *)__s->pVfs;
    pPVar19->xBusyHandler = btreeInvokeBusyHandler;
    pPVar19->pBusyHandlerArg = __s;
    psVar5 = pPVar19->fd->pMethods;
    if (psVar5 != (sqlite3_io_methods *)0x0) {
      (*psVar5->xFileControl)(pPVar19->fd,0xf,&pPVar19->xBusyHandler);
    }
    p->pBt = (BtShared *)__s;
    *(BtCursor **)&__s->tempFile = (BtCursor *)0x0;
    *(MemPage **)&__s->doNotSpill = (MemPage *)0x0;
    pPVar19 = (Pager *)__s->pVfs;
    if (pPVar19->readOnly != '\0') {
      puVar1 = (u16 *)((long)&__s->dbFileSize + 2);
      *(byte *)puVar1 = *(byte *)puVar1 | 1;
    }
    iVar8 = (int)((local_88 & 0xff) << 8);
    uVar12 = (uint)local_88._1_1_ * 0x10000 + iVar8;
    __s->nRec = uVar12;
    if (((iVar8 + (uint)local_88._1_1_ * 0x10000) - 0x10001 < 0xffff01ff) ||
       ((uVar12 + 0x1ffff & uVar12) != 0)) {
      __s->nRec = 0;
      uVar12 = 0;
      if (zFilename != (char *)0x0 && bVar7 == 0) {
        *(undefined2 *)((long)&__s->dbOrigSize + 1) = 0;
        uVar12 = 0;
      }
    }
    else {
      uVar12 = (uint)local_88._4_1_;
      puVar1 = (u16 *)((long)&__s->dbFileSize + 2);
      *puVar1 = *puVar1 | 2;
      *(bool *)((long)&__s->dbOrigSize + 1) =
           ((local_68._4_4_ >> 0x18 != 0 || (local_68 & 0xff000000000000) != 0) ||
           (local_68 & 0xff0000000000) != 0) || (local_68 & 0xff00000000) != 0;
      *(bool *)((long)&__s->dbOrigSize + 2) =
           (((uint)local_58 >> 0x18 != 0 || (local_58 & 0xff0000) != 0) || (local_58 & 0xff00) != 0)
           || (local_58 & 0xff) != 0;
    }
    iVar8 = sqlite3PagerSetPagesize(pPVar19,(u32 *)&__s->nRec,uVar12);
    if (iVar8 != 0) goto LAB_0011ed37;
    __s->cksumInit = __s->nRec - uVar12;
    if (p->sharable == '\0') {
      iVar8 = 0;
      goto LAB_0011e85b;
    }
    *(int *)&__s->journalOff = 1;
    if (sqlite3Config.bCoreMutex == 0) {
      psVar20 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar20 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    }
    if (sqlite3Config.bCoreMutex == 0) {
LAB_0011f4ed:
      if (psVar20 == (sqlite3_mutex *)0x0) {
        __s->journalHdr = (i64)sqlite3SharedCacheList;
        sqlite3SharedCacheList = (BtShared *)__s;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar20);
        __s->journalHdr = (i64)sqlite3SharedCacheList;
        sqlite3SharedCacheList = (BtShared *)__s;
        (*sqlite3Config.mutex.xMutexLeave)(psVar20);
      }
      iVar8 = 0;
      bVar35 = true;
    }
    else {
      psVar21 = (*sqlite3Config.mutex.xMutexAlloc)(0);
      __s->jfd = (sqlite3_file *)psVar21;
      if (psVar21 != (sqlite3_mutex *)0x0) goto LAB_0011f4ed;
      db->mallocFailed = '\0';
      iVar8 = 7;
      bVar35 = false;
    }
    if (!bVar35) goto LAB_0011ed37;
  }
LAB_0011e85b:
  if ((p->sharable != '\0') && (0 < (long)db->nDb)) {
    lVar24 = 0;
    do {
      pBVar13 = *(Btree **)((long)&db->aDb->pBt + lVar24);
      if ((pBVar13 != (Btree *)0x0) && (pBVar13->sharable != '\0')) goto LAB_0011e8a0;
      lVar24 = lVar24 + 0x20;
    } while ((long)db->nDb * 0x20 != lVar24);
  }
LAB_0011ed33:
  *ppBtree = p;
LAB_0011ed37:
  if (iVar8 == 0) {
    pvVar17 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
    if (pvVar17 == (void *)0x0) {
      pPVar3 = p->pBt->pPager->pPCache;
      pPVar3->szCache = 2000;
      (*sqlite3Config.pcache2.xCachesize)(pPVar3->pCache,2000);
    }
  }
  else {
    if ((__s != (Pager *)0x0) && ((Pager *)__s->pVfs != (Pager *)0x0)) {
      sqlite3PagerClose((Pager *)__s->pVfs);
    }
    sqlite3_free(__s);
    sqlite3_free(p);
    *ppBtree = (Btree *)0x0;
  }
  if (local_118 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_118);
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          EXTRA_SIZE, flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyhandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#ifdef SQLITE_SECURE_DELETE
    pBt->btsFlags |= BTS_SECURE_DELETE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      pBt->nRef = 1;
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM;
          db->mallocFailed = 0;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( p->pBt<pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && pSib->pNext->pBt<p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  return rc;
}